

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O3

bool anon_unknown.dwarf_ce93d7::ExpandMacros<cmCMakePresetsGraph::PackagePreset>
               (cmCMakePresetsGraph *graph,PackagePreset *preset,
               optional<cmCMakePresetsGraph::PackagePreset> *out)

{
  _Base_ptr p_Var1;
  _Rb_tree_node_base *p_Var2;
  char cVar3;
  element_type *peVar4;
  char cVar5;
  char cVar6;
  ExpandMacroResult EVar7;
  int iVar8;
  mapped_type *pmVar9;
  _Base_ptr p_Var10;
  _Rb_tree_node_base *p_Var11;
  _Link_type __x;
  optional<bool> result;
  vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
  macroExpanders;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
  envCycles;
  undefined1 local_b8 [24];
  undefined1 local_a0 [32];
  undefined1 local_80 [40];
  _Rb_tree_node_base local_58;
  undefined8 local_38;
  
  std::optional<cmCMakePresetsGraph::PackagePreset>::
  emplace<cmCMakePresetsGraph::PackagePreset_const&>(out,preset);
  local_58._M_left = &local_58;
  local_58._M_color = _S_red;
  local_58._M_parent = (_Base_ptr)0x0;
  local_38 = 0;
  p_Var10 = (out->super__Optional_base<cmCMakePresetsGraph::PackagePreset,_false,_false>)._M_payload
            .super__Optional_payload<cmCMakePresetsGraph::PackagePreset,_true,_false,_false>.
            super__Optional_payload_base<cmCMakePresetsGraph::PackagePreset>._M_payload._M_value.
            super_Preset.Environment._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = (_Base_ptr)
           ((long)&(out->super__Optional_base<cmCMakePresetsGraph::PackagePreset,_false,_false>).
                   _M_payload.
                   super__Optional_payload<cmCMakePresetsGraph::PackagePreset,_true,_false,_false>.
                   super__Optional_payload_base<cmCMakePresetsGraph::PackagePreset>._M_payload +
           0xb0);
  local_58._M_right = local_58._M_left;
  if (p_Var10 != p_Var1) {
    do {
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                             *)(local_80 + 0x20),(key_type *)(p_Var10 + 1));
      *pmVar9 = Unvisited;
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
    } while (p_Var10 != p_Var1);
  }
  local_b8._0_8_ = (pointer)0x0;
  local_b8._8_8_ = (_Base_ptr)0x0;
  local_b8._16_8_ = (_Base_ptr)0x0;
  local_80._24_8_ =
       std::
       _Function_handler<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCMakePresetsGraph.cxx:354:5)>
       ::_M_invoke;
  local_80._16_8_ =
       std::
       _Function_handler<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCMakePresetsGraph.cxx:354:5)>
       ::_M_manager;
  local_a0._8_8_ = 0;
  local_80._0_8_ = graph;
  local_80._8_8_ = preset;
  local_a0._0_8_ = operator_new(0x18);
  *(vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
    **)local_a0._0_8_ =
       (vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
        *)local_b8;
  *(optional<cmCMakePresetsGraph::PackagePreset> **)(local_a0._0_8_ + 8) = out;
  *(undefined1 **)(local_a0._0_8_ + 0x10) = local_80 + 0x20;
  local_a0._24_8_ =
       std::
       _Function_handler<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCMakePresetsGraph.cxx:413:5)>
       ::_M_invoke;
  local_a0._16_8_ =
       std::
       _Function_handler<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCMakePresetsGraph.cxx:413:5)>
       ::_M_manager;
  std::
  vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
  ::push_back((vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
               *)local_b8,(value_type *)local_80);
  std::
  vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
  ::push_back((vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
               *)local_b8,(value_type *)local_a0);
  p_Var10 = (out->super__Optional_base<cmCMakePresetsGraph::PackagePreset,_false,_false>)._M_payload
            .super__Optional_payload<cmCMakePresetsGraph::PackagePreset,_true,_false,_false>.
            super__Optional_payload_base<cmCMakePresetsGraph::PackagePreset>._M_payload._M_value.
            super_Preset.Environment._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (p_Var10 != p_Var1) {
    do {
      if ((char)p_Var10[3]._M_color == _S_black) {
        __x = (_Link_type)(p_Var10 + 1);
        pmVar9 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                               *)(local_80 + 0x20),(key_type *)__x);
        if (*pmVar9 != Verified) {
          if (*pmVar9 == InProgress) goto LAB_002b1b94;
          iVar8 = ((preset->super_Preset).OriginFile)->Version;
          *pmVar9 = InProgress;
          __x = (_Link_type)local_b8;
          EVar7 = ExpandMacros((string *)(p_Var10 + 2),
                               (vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                                *)local_b8,iVar8);
          if (EVar7 == Ok) {
            *pmVar9 = Verified;
          }
          else {
            if (EVar7 == Ignore) {
              cVar6 = '\x01';
              cVar5 = '\x01';
              if ((out->super__Optional_base<cmCMakePresetsGraph::PackagePreset,_false,_false>).
                  _M_payload.
                  super__Optional_payload<cmCMakePresetsGraph::PackagePreset,_true,_false,_false>.
                  super__Optional_payload_base<cmCMakePresetsGraph::PackagePreset>._M_engaged !=
                  true) goto LAB_002b1b96;
              goto LAB_002b1b5f;
            }
            if (EVar7 == Error) goto LAB_002b1b94;
          }
        }
      }
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
    } while (p_Var10 != p_Var1);
  }
  peVar4 = (preset->super_Preset).ConditionEvaluator.
           super___shared_ptr<cmCMakePresetsGraph::Condition,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar4 == (element_type *)0x0) {
    p_Var11 = *(_Rb_tree_node_base **)
               ((long)&(out->super__Optional_base<cmCMakePresetsGraph::PackagePreset,_false,_false>)
                       ._M_payload.
                       super__Optional_payload<cmCMakePresetsGraph::PackagePreset,_true,_false,_false>
                       .super__Optional_payload_base<cmCMakePresetsGraph::PackagePreset>._M_payload
               + 0x148);
    p_Var2 = (_Rb_tree_node_base *)
             ((long)&(out->super__Optional_base<cmCMakePresetsGraph::PackagePreset,_false,_false>).
                     _M_payload.
                     super__Optional_payload<cmCMakePresetsGraph::PackagePreset,_true,_false,_false>
                     .super__Optional_payload_base<cmCMakePresetsGraph::PackagePreset>._M_payload +
             0x138);
    if (p_Var11 != p_Var2) {
      do {
        __x = (_Link_type)local_b8;
        EVar7 = ExpandMacros((string *)(p_Var11 + 2),
                             (vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                              *)local_b8,((preset->super_Preset).OriginFile)->Version);
        if (EVar7 == Error) goto LAB_002b1b94;
        if (EVar7 == Ignore) goto LAB_002b1b2a;
        p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
      } while (p_Var11 != p_Var2);
    }
    __x = (_Link_type)local_b8;
    EVar7 = ExpandMacros(&(out->
                          super__Optional_base<cmCMakePresetsGraph::PackagePreset,_false,_false>).
                          _M_payload.
                          super__Optional_payload<cmCMakePresetsGraph::PackagePreset,_true,_false,_false>
                          .super__Optional_payload_base<cmCMakePresetsGraph::PackagePreset>.
                          _M_payload._M_value.ConfigFile,
                         (vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                          *)__x,((preset->super_Preset).OriginFile)->Version);
    if (EVar7 == Error) {
LAB_002b1b94:
      cVar6 = '\0';
      goto LAB_002b1b96;
    }
    if (EVar7 != Ignore) {
      __x = (_Link_type)local_b8;
      EVar7 = ExpandMacros(&(out->
                            super__Optional_base<cmCMakePresetsGraph::PackagePreset,_false,_false>).
                            _M_payload.
                            super__Optional_payload<cmCMakePresetsGraph::PackagePreset,_true,_false,_false>
                            .super__Optional_payload_base<cmCMakePresetsGraph::PackagePreset>.
                            _M_payload._M_value.PackageName,
                           (vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                            *)__x,((preset->super_Preset).OriginFile)->Version);
      if (EVar7 == Error) goto LAB_002b1b94;
      if (EVar7 != Ignore) {
        __x = (_Link_type)local_b8;
        EVar7 = ExpandMacros(&(out->
                              super__Optional_base<cmCMakePresetsGraph::PackagePreset,_false,_false>
                              )._M_payload.
                              super__Optional_payload<cmCMakePresetsGraph::PackagePreset,_true,_false,_false>
                              .super__Optional_payload_base<cmCMakePresetsGraph::PackagePreset>.
                              _M_payload._M_value.PackageVersion,
                             (vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                              *)__x,((preset->super_Preset).OriginFile)->Version);
        if (EVar7 == Error) goto LAB_002b1b94;
        if (EVar7 != Ignore) {
          __x = (_Link_type)local_b8;
          EVar7 = ExpandMacros(&(out->
                                super__Optional_base<cmCMakePresetsGraph::PackagePreset,_false,_false>
                                )._M_payload.
                                super__Optional_payload<cmCMakePresetsGraph::PackagePreset,_true,_false,_false>
                                .super__Optional_payload_base<cmCMakePresetsGraph::PackagePreset>.
                                _M_payload._M_value.PackageDirectory,
                               (vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                                *)__x,((preset->super_Preset).OriginFile)->Version);
          if (EVar7 == Error) goto LAB_002b1b94;
          if (EVar7 != Ignore) {
            __x = (_Link_type)local_b8;
            EVar7 = ExpandMacros(&(out->
                                  super__Optional_base<cmCMakePresetsGraph::PackagePreset,_false,_false>
                                  )._M_payload.
                                  super__Optional_payload<cmCMakePresetsGraph::PackagePreset,_true,_false,_false>
                                  .super__Optional_payload_base<cmCMakePresetsGraph::PackagePreset>.
                                  _M_payload._M_value.VendorName,
                                 (vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                                  *)__x,((preset->super_Preset).OriginFile)->Version);
            if (EVar7 == Error) goto LAB_002b1b94;
            cVar6 = '\x01';
            if (EVar7 != Ignore) goto LAB_002b1b96;
          }
        }
      }
    }
LAB_002b1b2a:
    cVar6 = '\x01';
    cVar3 = (out->super__Optional_base<cmCMakePresetsGraph::PackagePreset,_false,_false>)._M_payload
            .super__Optional_payload<cmCMakePresetsGraph::PackagePreset,_true,_false,_false>.
            super__Optional_payload_base<cmCMakePresetsGraph::PackagePreset>._M_engaged;
  }
  else {
    __x = (_Link_type)local_b8;
    iVar8 = (*peVar4->_vptr_Condition[2])
                      (peVar4,__x,(ulong)(uint)((preset->super_Preset).OriginFile)->Version);
    cVar6 = (char)iVar8;
    if (cVar6 == '\0') goto LAB_002b1b96;
    cVar3 = (out->super__Optional_base<cmCMakePresetsGraph::PackagePreset,_false,_false>)._M_payload
            .super__Optional_payload<cmCMakePresetsGraph::PackagePreset,_true,_false,_false>.
            super__Optional_payload_base<cmCMakePresetsGraph::PackagePreset>._M_engaged;
  }
  cVar5 = cVar6;
  if (cVar3 == '\x01') {
LAB_002b1b5f:
    cVar6 = cVar5;
    (out->super__Optional_base<cmCMakePresetsGraph::PackagePreset,_false,_false>)._M_payload.
    super__Optional_payload<cmCMakePresetsGraph::PackagePreset,_true,_false,_false>.
    super__Optional_payload_base<cmCMakePresetsGraph::PackagePreset>._M_engaged = false;
    cmCMakePresetsGraph::PackagePreset::~PackagePreset((PackagePreset *)out);
  }
LAB_002b1b96:
  if ((_Base_ptr)local_a0._16_8_ != (_Base_ptr)0x0) {
    __x = (_Link_type)local_a0;
    (*(code *)local_a0._16_8_)(__x,__x,3);
  }
  if ((_Base_ptr)local_80._16_8_ != (_Base_ptr)0x0) {
    __x = (_Link_type)local_80;
    (*(code *)local_80._16_8_)(__x,__x,3);
  }
  std::
  vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
  ::~vector((vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
             *)local_b8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
  ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
              *)local_58._M_parent,__x);
  return (bool)cVar6;
}

Assistant:

bool ExpandMacros(const cmCMakePresetsGraph& graph, const T& preset,
                  cm::optional<T>& out)
{
  out.emplace(preset);

  std::map<std::string, CycleStatus> envCycles;
  for (auto const& v : out->Environment) {
    envCycles[v.first] = CycleStatus::Unvisited;
  }

  std::vector<MacroExpander> macroExpanders;

  MacroExpander defaultMacroExpander =
    [&graph, &preset](const std::string& macroNamespace,
                      const std::string& macroName, std::string& macroOut,
                      int version) -> ExpandMacroResult {
    if (macroNamespace.empty()) {
      if (macroName == "sourceDir") {
        macroOut += graph.SourceDir;
        return ExpandMacroResult::Ok;
      }
      if (macroName == "sourceParentDir") {
        macroOut += cmSystemTools::GetParentDirectory(graph.SourceDir);
        return ExpandMacroResult::Ok;
      }
      if (macroName == "sourceDirName") {
        macroOut += cmSystemTools::GetFilenameName(graph.SourceDir);
        return ExpandMacroResult::Ok;
      }
      if (macroName == "presetName") {
        macroOut += preset.Name;
        return ExpandMacroResult::Ok;
      }
      if (macroName == "generator") {
        // Generator only makes sense if preset is not hidden.
        if (!preset.Hidden) {
          macroOut += graph.GetGeneratorForPreset(preset.Name);
        }
        return ExpandMacroResult::Ok;
      }
      if (macroName == "dollar") {
        macroOut += '$';
        return ExpandMacroResult::Ok;
      }
      if (macroName == "hostSystemName") {
        if (version < 3) {
          return ExpandMacroResult::Error;
        }
        macroOut += cmSystemTools::GetSystemName();
        return ExpandMacroResult::Ok;
      }
      if (macroName == "fileDir") {
        if (version < 4) {
          return ExpandMacroResult::Error;
        }
        macroOut +=
          cmSystemTools::GetParentDirectory(preset.OriginFile->Filename);
        return ExpandMacroResult::Ok;
      }
      if (macroName == "pathListSep") {
        if (version < 5) {
          return ExpandMacroResult::Error;
        }
        macroOut += cmSystemTools::GetSystemPathlistSeparator();
        return ExpandMacroResult::Ok;
      }
    }

    return ExpandMacroResult::Ignore;
  };

  MacroExpander environmentMacroExpander =
    [&macroExpanders, &out, &envCycles](
      const std::string& macroNamespace, const std::string& macroName,
      std::string& result, int version) -> ExpandMacroResult {
    if (macroNamespace == "env" && !macroName.empty() && out) {
      auto v = out->Environment.find(macroName);
      if (v != out->Environment.end() && v->second) {
        auto e =
          VisitEnv(*v->second, envCycles[macroName], macroExpanders, version);
        if (e != ExpandMacroResult::Ok) {
          return e;
        }
        result += *v->second;
        return ExpandMacroResult::Ok;
      }
    }

    if (macroNamespace == "env" || macroNamespace == "penv") {
      if (macroName.empty()) {
        return ExpandMacroResult::Error;
      }
      const char* value = std::getenv(macroName.c_str());
      if (value) {
        result += value;
      }
      return ExpandMacroResult::Ok;
    }

    return ExpandMacroResult::Ignore;
  };

  macroExpanders.push_back(defaultMacroExpander);
  macroExpanders.push_back(environmentMacroExpander);

  for (auto& v : out->Environment) {
    if (v.second) {
      switch (VisitEnv(*v.second, envCycles[v.first], macroExpanders,
                       graph.GetVersion(preset))) {
        case ExpandMacroResult::Error:
          return false;
        case ExpandMacroResult::Ignore:
          out.reset();
          return true;
        case ExpandMacroResult::Ok:
          break;
      }
    }
  }

  if (preset.ConditionEvaluator) {
    cm::optional<bool> result;
    if (!preset.ConditionEvaluator->Evaluate(
          macroExpanders, graph.GetVersion(preset), result)) {
      return false;
    }
    if (!result) {
      out.reset();
      return true;
    }
    out->ConditionResult = *result;
  }

  return ExpandMacros(graph, preset, out, macroExpanders);
}